

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O1

char * light_pcapng_to_string(light_pcapng pcapng)

{
  _light_pcapng **pp_Var1;
  uint uVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char *__s;
  size_t sVar7;
  light_pcapng iterator;
  _light_pcapng *p_Var8;
  char *__dest;
  
  pcVar6 = (char *)0x0;
  p_Var8 = pcapng;
  if (pcapng != (light_pcapng)0x0) {
    do {
      pp_Var1 = &p_Var8->next_block;
      uVar4 = (int)pcVar6 + 0x80;
      pcVar6 = (char *)(ulong)uVar4;
      p_Var8 = *pp_Var1;
    } while (*pp_Var1 != (_light_pcapng *)0x0);
    pcVar6 = (char *)calloc((ulong)uVar4,1);
    __dest = pcVar6;
    if (pcVar6 == (char *)0x0) {
      light_pcapng_to_string_cold_1();
      pcVar6 = (char *)0x0;
    }
    else {
      do {
        __s = (char *)calloc(0x80,1);
        uVar4 = pcapng->block_type;
        uVar2 = pcapng->block_total_lenght;
        puVar3 = pcapng->block_body;
        uVar5 = __option_count(pcapng->options);
        sprintf(__s,"---\nType = 0x%X\nLength = %u\nData Pointer = %p\nOption count = %d\n---\n",
                (ulong)uVar4,(ulong)uVar2,puVar3,(ulong)uVar5);
        sVar7 = strlen(__s);
        memcpy(__dest,__s,sVar7);
        sVar7 = strlen(__s);
        free(__s);
        pcapng = pcapng->next_block;
        __dest = __dest + sVar7;
      } while (pcapng != (_light_pcapng *)0x0);
    }
  }
  return pcVar6;
}

Assistant:

char *light_pcapng_to_string(light_pcapng pcapng)
{
	if (pcapng == NULL)
		return NULL;

	light_pcapng iter = pcapng;
	uint32_t block_count = light_get_block_count(pcapng);
	size_t buffer_size = 128 * block_count;
	char *string = calloc(buffer_size, sizeof(char));
	char *offset = string;
	DCHECK_NULLP(offset, return NULL);

	while (iter != NULL) {
		char *next = calloc(128, 1);

		sprintf(next, "---\nType = 0x%X\nLength = %u\nData Pointer = %p\nOption count = %d\n---\n",
				iter->block_type, iter->block_total_lenght, (void*)iter->block_body, __option_count(iter->options));

		memcpy(offset, next, strlen(next));
		offset += strlen(next);
		free(next);
		iter = iter->next_block;
	}

	return string;
}